

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGearConstraint.h
# Opt level: O0

char * __thiscall
btGearConstraint::serialize(btGearConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  long in_RSI;
  long in_RDI;
  btSerializer *unaff_retaddr;
  btGearConstraintFloatData *gear;
  
  btTypedConstraint::serialize((btTypedConstraint *)serializer,gear,unaff_retaddr);
  btVector3::serialize((btVector3 *)(in_RDI + 0x48),(btVector3FloatData *)(in_RSI + 0x40));
  btVector3::serialize((btVector3 *)(in_RDI + 0x58),(btVector3FloatData *)(in_RSI + 0x50));
  *(undefined4 *)(in_RSI + 0x60) = *(undefined4 *)(in_RDI + 0x6c);
  return "btGearConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGearConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGearConstraintData* gear = (btGearConstraintData*)dataBuffer;
	btTypedConstraint::serialize(&gear->m_typeConstraintData,serializer);

	m_axisInA.serialize( gear->m_axisInA );
	m_axisInB.serialize( gear->m_axisInB );

	gear->m_ratio = m_ratio;

	return btGearConstraintDataName;
}